

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O2

void tlpperf_target_mode(size_t target_size)

{
  ulong uVar1;
  int __fd;
  void *pvVar2;
  ulong uVar3;
  __off_t _Var4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_t __len;
  char *pcVar8;
  ulong local_30;
  
  __len = (target_size & 0xfffffffffffff000) + 0x1000;
  pvVar2 = mmap((void *)0x0,__len,3,0x42022,-1,0);
  if (pvVar2 == (void *)0xffffffffffffffff) {
    fprintf(_stderr,"%s:ERR: failed to allocate %lu-byte from hugepage\n","tlpperf_target_mode",
            __len);
    perror("mmap");
    return;
  }
  local_30 = 0;
  __fd = open("/proc/self/pagemap",0);
  if (__fd < 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    pcVar8 = "open /proc/self/pagemap: %s\n";
  }
  else {
    uVar3 = sysconf(0x1e);
    _Var4 = lseek(__fd,((ulong)pvVar2 / uVar3) * 8,0);
    if (_Var4 < 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      pcVar8 = "lseek for /proc/self/pagemap: %s\n";
    }
    else {
      sVar5 = read(__fd,&local_30,8);
      uVar1 = local_30;
      if ((0 < sVar5) && (local_30 != 0)) {
        close(__fd);
        printf("%lu-byte allocated, physical address is %#lx\n",__len,
               (ulong)pvVar2 % uVar3 + (uVar1 & 0x7fffffffffffff) * uVar3);
        do {
          sleep(1);
        } while( true );
      }
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      pcVar8 = "read for /proc/self/pagemap: %s\n";
    }
  }
  err(1,pcVar8,pcVar7);
  puts(
      "tlpperf usage\n\n  basic parameters\n    -r X.X.X.X  remote addr at NetTLP link\n    -l X.X.X.X  local addr at NetTLP link\n    -b XX:XX    bus number of requester\n\n  DMA parameters\n    -d read|write  DMA direction\n    -a 0xADDR      DMA target region address (physical)\n    -s u_int       DMA target region size\n    -L u_int       DMA length (spilited into MPS and MRRS)\n\n  benchmark style parameters\n    -N u_int                  number of thread\n    -R same|diff              how to split DMA region for threads\n    -P fix|seq|seq512|random  access pattern on each reagion\n    -M                        measuring latency mode\n\n  options\n    -c int   count of interations on each thread\n    -i msec  interval for each iteration\n    -t sec   duration\n    -D       debug mode\n\n  for target host\n    -S size  size to allocate hugepage as tlpperf target"
      );
  return;
}

Assistant:

void tlpperf_target_mode(size_t target_size)
{
	/* target mode allocates 'size'-byte hugepage and wait forever */
	void *mem;
	uintptr_t paddr;
	size_t size = ((target_size >> 12) + 1) << 12;

	mem = mmap(0, size, PROT_READ | PROT_WRITE,
		   MAP_PRIVATE | MAP_ANONYMOUS | MAP_LOCKED | MAP_HUGETLB,
		   -1, 0);
	if (mem == MAP_FAILED) {
		pr_err("failed to allocate %lu-byte from hugepage\n", size);
		perror("mmap");
		return;
	}

	paddr = phy_addr(mem);
	printf("%lu-byte allocated, physical address is %#lx\n", size, paddr);

	while (1)
		sleep(1);
}